

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_name_resolver.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::java::ClassNameResolver::HasConflictingClassName
          (ClassNameResolver *this,FileDescriptor *file,string *classname)

{
  int iVar1;
  long lVar2;
  pointer pcVar3;
  size_t sVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  Descriptor *message;
  ulong uVar9;
  
  iVar1 = *(int *)(file + 0x68);
  if (0 < (long)iVar1) {
    lVar2 = *(long *)(file + 0x70);
    pcVar3 = (classname->_M_dataplus)._M_p;
    sVar4 = classname->_M_string_length;
    lVar7 = 0;
    do {
      if ((*(undefined8 **)(lVar2 + lVar7))[1] == sVar4) {
        if (sVar4 == 0) {
          return true;
        }
        iVar6 = bcmp((void *)**(undefined8 **)(lVar2 + lVar7),pcVar3,sVar4);
        if (iVar6 == 0) {
          return true;
        }
      }
      lVar7 = lVar7 + 0x38;
    } while ((long)iVar1 * 0x38 - lVar7 != 0);
  }
  iVar1 = *(int *)(file + 0x78);
  if (0 < (long)iVar1) {
    lVar2 = *(long *)(file + 0x80);
    pcVar3 = (classname->_M_dataplus)._M_p;
    sVar4 = classname->_M_string_length;
    lVar7 = 0;
    do {
      if ((*(undefined8 **)(lVar2 + lVar7))[1] == sVar4) {
        if (sVar4 == 0) {
          return true;
        }
        iVar6 = bcmp((void *)**(undefined8 **)(lVar2 + lVar7),pcVar3,sVar4);
        if (iVar6 == 0) {
          return true;
        }
      }
      lVar7 = lVar7 + 0x30;
    } while ((long)iVar1 * 0x30 != lVar7);
  }
  uVar8 = (ulong)*(int *)(file + 0x58);
  if ((long)uVar8 < 1) {
    bVar5 = false;
  }
  else {
    message = *(Descriptor **)(file + 0x60);
    uVar9 = 0;
    do {
      bVar5 = anon_unknown_0::MessageHasConflictingClassName(message,classname);
      if (bVar5) {
        return true;
      }
      uVar9 = uVar9 + 1;
      message = message + 0xa8;
    } while (uVar8 != uVar9);
    bVar5 = uVar9 < uVar8;
  }
  return bVar5;
}

Assistant:

bool ClassNameResolver::HasConflictingClassName(
    const FileDescriptor* file, const string& classname) {
  for (int i = 0; i < file->enum_type_count(); i++) {
    if (file->enum_type(i)->name() == classname) {
      return true;
    }
  }
  for (int i = 0; i < file->service_count(); i++) {
    if (file->service(i)->name() == classname) {
      return true;
    }
  }
  for (int i = 0; i < file->message_type_count(); i++) {
    if (MessageHasConflictingClassName(file->message_type(i), classname)) {
      return true;
    }
  }
  return false;
}